

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O2

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_numeric
          (ProtocolReader *this,FieldType *value,EventKlassField *field)

{
  Stream *pSVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  size_t sVar5;
  uint64_t uVar6;
  char buff [16];
  uint8_t local_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  undefined4 uStack_34;
  
  pSVar1 = (this->_stream)._M_t.
           super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
           .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl;
  sVar5 = EventKlassField::get_sizeof(field);
  iVar3 = (*pSVar1->_vptr_Stream[3])(pSVar1,&local_38,sVar5);
  if ((char)iVar3 == '\0') {
LAB_001145d7:
    return false;
  }
  switch(field->_type_id) {
  case UINT8:
  case INT8:
    value->f_UINT8 = local_38;
    return true;
  case UINT16:
    uVar2 = convert_endianness_to_native(CONCAT11(uStack_37,local_38),this->_endianness);
    break;
  case INT16:
    uVar2 = convert_endianness_to_native(CONCAT11(uStack_37,local_38),this->_endianness);
    break;
  case UINT32:
    uVar4 = convert_endianness_to_native
                      (CONCAT22(uStack_36,CONCAT11(uStack_37,local_38)),this->_endianness);
    goto LAB_001145be;
  case INT32:
    uVar4 = convert_endianness_to_native
                      (CONCAT22(uStack_36,CONCAT11(uStack_37,local_38)),this->_endianness);
LAB_001145be:
    value->f_INT32 = uVar4;
    return true;
  case UINT64:
    uVar6 = convert_endianness_to_native
                      (CONCAT44(uStack_34,CONCAT22(uStack_36,CONCAT11(uStack_37,local_38))),
                       this->_endianness);
    goto LAB_001145d2;
  case INT64:
    uVar6 = convert_endianness_to_native
                      (CONCAT44(uStack_34,CONCAT22(uStack_36,CONCAT11(uStack_37,local_38))),
                       this->_endianness);
LAB_001145d2:
    value->f_INT64 = uVar6;
    return true;
  case POINTER:
    goto LAB_001145d7;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                  ,0xd0,
                  "bool HawkTracer::parser::ProtocolReader::_read_numeric(FieldType &, const EventKlassField &)"
                 );
  }
  value->f_INT16 = uVar2;
  return true;
}

Assistant:

bool ProtocolReader::_read_numeric(FieldType& value, const EventKlassField& field)
{
    char buff[16];
    if (!_stream->read_data(buff, field.get_sizeof()))
    {
        return false;
    }

    switch (field.get_type_id())
    {
#define SET_VALUE(field_id, c_type) case FieldTypeId::field_id: value.f_##field_id = convert_endianness_to_native(*((c_type*)buff), _endianness); break
    SET_VALUE(UINT8, uint8_t);
    SET_VALUE(INT8, int8_t);
    SET_VALUE(UINT16, uint16_t);
    SET_VALUE(INT16, int16_t);
    SET_VALUE(UINT32, uint32_t);
    SET_VALUE(INT32, int32_t);
    SET_VALUE(UINT64, uint64_t);
    SET_VALUE(INT64, int64_t);
#undef SET_VALUE
    case FieldTypeId::POINTER:
        return false;
        break;
    default: assert(0); return false;
    }

    return true;
}